

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_getCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,int compressionLevel,
          unsigned_long_long srcSizeHint,size_t dictSize,ZSTD_cParamMode_e mode)

{
  ZSTD_strategy ZVar1;
  ZSTD_compressionParameters cPar;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  U64 UVar7;
  ZSTD_compressionParameters *pZVar8;
  int local_74;
  int clampedCompressionLevel;
  ZSTD_compressionParameters cp;
  int row;
  U32 tableID;
  U64 rSize;
  ZSTD_cParamMode_e mode_local;
  size_t dictSize_local;
  unsigned_long_long srcSizeHint_local;
  int compressionLevel_local;
  
  UVar7 = ZSTD_getCParamRowSize(srcSizeHint,dictSize,mode);
  if (compressionLevel == 0) {
    cp.strategy = ZSTD_greedy;
  }
  else if (compressionLevel < 0) {
    cp.strategy = 0;
  }
  else {
    cp.strategy = compressionLevel;
    if (0x16 < compressionLevel) {
      cp.strategy = 0x16;
    }
  }
  pZVar8 = ZSTD_defaultCParameters
           [(uint)(UVar7 < 0x40001) + (uint)(UVar7 < 0x20001) + (uint)(UVar7 < 0x4001)] +
           (int)cp.strategy;
  uVar2 = pZVar8->windowLog;
  uVar3 = pZVar8->chainLog;
  uVar4 = pZVar8->hashLog;
  uVar5 = pZVar8->searchLog;
  cPar.searchLog = uVar5;
  cPar.hashLog = uVar4;
  cPar.chainLog = uVar3;
  cPar.windowLog = uVar2;
  cp.hashLog = pZVar8->minMatch;
  cp.searchLog = pZVar8->targetLength;
  ZVar1 = pZVar8->strategy;
  if (compressionLevel < 0) {
    iVar6 = ZSTD_minCLevel();
    local_74 = compressionLevel;
    if (compressionLevel < iVar6) {
      local_74 = ZSTD_minCLevel();
    }
    cp.searchLog = -local_74;
  }
  cPar.minMatch = cp.hashLog;
  cPar.targetLength = cp.searchLog;
  cPar.strategy = ZVar1;
  ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,dictSize,mode);
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters ZSTD_getCParams_internal(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode)
{
    U64 const rSize = ZSTD_getCParamRowSize(srcSizeHint, dictSize, mode);
    U32 const tableID = (rSize <= 256 KB) + (rSize <= 128 KB) + (rSize <= 16 KB);
    int row;
    DEBUGLOG(5, "ZSTD_getCParams_internal (cLevel=%i)", compressionLevel);

    /* row */
    if (compressionLevel == 0) row = ZSTD_CLEVEL_DEFAULT;   /* 0 == default */
    else if (compressionLevel < 0) row = 0;   /* entry 0 is baseline for fast mode */
    else if (compressionLevel > ZSTD_MAX_CLEVEL) row = ZSTD_MAX_CLEVEL;
    else row = compressionLevel;

    {   ZSTD_compressionParameters cp = ZSTD_defaultCParameters[tableID][row];
        DEBUGLOG(5, "ZSTD_getCParams_internal selected tableID: %u row: %u strat: %u", tableID, row, (U32)cp.strategy);
        /* acceleration factor */
        if (compressionLevel < 0) {
            int const clampedCompressionLevel = MAX(ZSTD_minCLevel(), compressionLevel);
            cp.targetLength = (unsigned)(-clampedCompressionLevel);
        }
        /* refine parameters based on srcSize & dictSize */
        return ZSTD_adjustCParams_internal(cp, srcSizeHint, dictSize, mode);
    }
}